

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.hpp
# Opt level: O0

void __thiscall
ear::CartesianSpeakerPosition::~CartesianSpeakerPosition(CartesianSpeakerPosition *this)

{
  CartesianSpeakerPosition *this_local;
  
  ScreenEdgeLock::~ScreenEdgeLock(&this->screenEdgeLock);
  return;
}

Assistant:

struct EAR_EXPORT CartesianSpeakerPosition {
    CartesianSpeakerPosition(double X = 0.0, double Y = 1.0, double Z = 0.0)
        : X(X), Y(Y), Z(Z){};
    double X;
    boost::optional<double> XMin;
    boost::optional<double> XMax;
    double Y;
    boost::optional<double> YMin;
    boost::optional<double> YMax;
    double Z;
    boost::optional<double> ZMin;
    boost::optional<double> ZMax;
    ScreenEdgeLock screenEdgeLock;
  }